

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O1

int private_connect(SOCKET sockfd,sockaddr *serv_addr,socklen_t addrlen)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int valopt;
  timeval tmvTimeout;
  fd_set fdSet;
  int local_c0 [2];
  timeval local_b8;
  fd_set local_a8;
  
  iVar1 = sock_make_no_blocking(sockfd);
  if (iVar1 == -1) {
    return -1;
  }
  iVar2 = connect(sockfd,(sockaddr *)serv_addr,addrlen);
  local_b8.tv_sec = 5;
  local_b8.tv_usec = 0;
  local_a8.fds_bits[0xe] = 0;
  local_a8.fds_bits[0xf] = 0;
  local_a8.fds_bits[0xc] = 0;
  local_a8.fds_bits[0xd] = 0;
  local_a8.fds_bits[10] = 0;
  local_a8.fds_bits[0xb] = 0;
  local_a8.fds_bits[8] = 0;
  local_a8.fds_bits[9] = 0;
  local_a8.fds_bits[6] = 0;
  local_a8.fds_bits[7] = 0;
  local_a8.fds_bits[4] = 0;
  local_a8.fds_bits[5] = 0;
  iVar1 = sockfd + 0x3f;
  if (-1 < sockfd) {
    iVar1 = sockfd;
  }
  local_a8.fds_bits[2] = 0;
  local_a8.fds_bits[3] = 0;
  local_a8.fds_bits[0] = 0;
  local_a8.fds_bits[1] = 0;
  local_a8.fds_bits[iVar1 >> 6] = local_a8.fds_bits[iVar1 >> 6] | 1L << ((byte)sockfd & 0x3f);
  if ((iVar2 < 0) && (piVar3 = __errno_location(), *piVar3 == 0x73)) {
    iVar1 = select(sockfd + 1,(fd_set *)0x0,&local_a8,(fd_set *)0x0,&local_b8);
    if (iVar1 < 1) {
      return -1;
    }
    local_c0[0] = 0;
    local_c0[1] = 4;
    iVar1 = getsockopt(sockfd,1,4,local_c0,(socklen_t *)(local_c0 + 1));
    if (iVar1 < 0) {
      return -1;
    }
    if (local_c0[0] != 0) {
      return -1;
    }
  }
  iVar1 = sock_make_blocking(sockfd);
  return iVar1;
}

Assistant:

static int private_connect(
	SOCKET sockfd, const struct sockaddr *serv_addr, socklen_t addrlen)
{
#ifndef UPNP_ENABLE_BLOCKING_TCP_CONNECTIONS
	int ret = sock_make_no_blocking(sockfd);
	if (ret != -1) {
		ret = connect(sockfd, serv_addr, addrlen);
		ret = Check_Connect_And_Wait_Connection(sockfd, ret);
		if (ret != -1) {
			ret = sock_make_blocking(sockfd);
		}
	}

	return ret;
#else
	return connect(sockfd, serv_addr, addrlen);
#endif /* UPNP_ENABLE_BLOCKING_TCP_CONNECTIONS */
}